

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.h
# Opt level: O2

void __thiscall uWS::HttpResponse<true>::writeUnsignedHex(HttpResponse<true> *this,uint value)

{
  uint uVar1;
  char buf [10];
  char local_1a [10];
  
  uVar1 = utils::u32toaHex(value,local_1a);
  AsyncSocket<true>::write((AsyncSocket<true> *)this,(int)local_1a,(void *)(ulong)uVar1,0);
  return;
}

Assistant:

void writeUnsignedHex(unsigned int value) {
        char buf[10];
        int length = utils::u32toaHex(value, buf);

        /* For now we do this copy */
        Super::write(buf, length);
    }